

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combine_access_chains.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::CombineAccessChains::CombineIndices
          (CombineAccessChains *this,Instruction *ptr_input,Instruction *inst,
          vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *new_operands)

{
  char cVar1;
  IRContext *pIVar2;
  DefUseManager *this_00;
  ConstantManager *this_01;
  Analysis AVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  uint32_t op2;
  Instruction *pIVar7;
  Constant *pCVar8;
  Instruction *inst_00;
  Constant *constant_inst;
  Type *pTVar9;
  undefined4 extraout_var;
  IRContext *this_02;
  uint uVar10;
  CombineAccessChains *this_03;
  bool bVar11;
  InstructionBuilder builder;
  undefined1 local_88 [40];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_60;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  pIVar2 = (this->super_Pass).context_;
  AVar3 = pIVar2->valid_analyses_;
  this_02 = pIVar2;
  if ((AVar3 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
    this_02 = (this->super_Pass).context_;
    AVar3 = this_02->valid_analyses_;
  }
  this_00 = (pIVar2->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  if ((AVar3 >> 0xe & 1) == 0) {
    IRContext::BuildConstantManager(this_02);
  }
  this_01 = (this_02->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  uVar4 = Instruction::GetSingleWordOperand
                    (ptr_input,
                     (int)((ulong)((long)(ptr_input->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(ptr_input->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - 1);
  pIVar7 = analysis::DefUseManager::GetDef(this_00,uVar4);
  pCVar8 = analysis::ConstantManager::GetConstantFromInst(this_01,pIVar7);
  uVar10 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar10 = (uint)inst->has_result_id_;
  }
  uVar4 = Instruction::GetSingleWordOperand(inst,uVar10 + 1);
  inst_00 = analysis::DefUseManager::GetDef(this_00,uVar4);
  constant_inst = analysis::ConstantManager::GetConstantFromInst(this_01,inst_00);
  if (((inst->opcode_ == OpInBoundsPtrAccessChain) || (inst->opcode_ == OpPtrAccessChain)) &&
     ((ptr_input->opcode_ == OpInBoundsPtrAccessChain || (ptr_input->opcode_ == OpPtrAccessChain))))
  {
    uVar10 = (ptr_input->has_result_id_ & 1) + 1;
    if (ptr_input->has_type_id_ == false) {
      uVar10 = (uint)ptr_input->has_result_id_;
    }
    bVar11 = (int)((ulong)((long)(ptr_input->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(ptr_input->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
             uVar10 == 2;
  }
  else {
    bVar11 = false;
  }
  this_03 = this;
  pTVar9 = GetIndexedType(this,ptr_input);
  if ((pCVar8 == (Constant *)0x0) || (constant_inst == (Constant *)0x0)) {
    iVar6 = (*pTVar9->_vptr_Type[0x1c])(pTVar9);
    uVar4 = 0;
    if ((bool)(~bVar11 & CONCAT44(extraout_var,iVar6) != 0)) goto LAB_001d176a;
    pIVar2 = (this->super_Pass).context_;
    local_88._8_8_ = IRContext::get_instr_block(pIVar2,inst);
    local_88[0x18] = '\x03';
    local_88[0x19] = '\0';
    local_88[0x1a] = '\0';
    local_88[0x1b] = '\0';
    local_88._0_8_ = pIVar2;
    local_88._16_8_ = inst;
    if (pIVar7->has_type_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand(pIVar7,0);
    }
    op2 = 0;
    uVar5 = 0;
    if (pIVar7->has_result_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
    }
    if (inst_00->has_result_id_ == true) {
      op2 = Instruction::GetSingleWordOperand(inst_00,(uint)inst_00->has_type_id_);
    }
    pIVar7 = InstructionBuilder::AddIAdd((InstructionBuilder *)local_88,uVar4,uVar5,op2);
    cVar1 = pIVar7->has_result_id_;
  }
  else {
    uVar4 = GetConstantValue(this_03,pCVar8);
    uVar5 = GetConstantValue(this_03,constant_inst);
    pTVar9 = pCVar8->type_;
    local_88._0_8_ = operator_new(4);
    local_88._8_8_ = (long)&((IRContext *)local_88._0_8_)->syntax_context_ + 4;
    *(uint32_t *)&((IRContext *)local_88._0_8_)->syntax_context_ = uVar5 + uVar4;
    local_88._16_8_ = local_88._8_8_;
    pCVar8 = analysis::ConstantManager::GetConstant
                       (this_01,pTVar9,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
    if ((IRContext *)local_88._0_8_ != (IRContext *)0x0) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
    }
    pIVar7 = analysis::ConstantManager::GetDefiningInstruction
                       (this_01,pCVar8,0,(inst_iterator *)0x0);
    cVar1 = pIVar7->has_result_id_;
  }
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  if (cVar1 == '\x01') {
    local_58._16_4_ = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
  }
  local_58._24_8_ = local_58 + 0x10;
  local_58._0_8_ = &PTR__SmallVector_003d7c78;
  local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_58._8_8_ = 1;
  local_88._0_4_ = 1;
  local_88._8_8_ = &PTR__SmallVector_003d7c78;
  local_88._16_8_ = (Instruction *)0x0;
  local_88._32_8_ = local_88 + 0x18;
  local_60._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_88 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(new_operands,(Operand *)local_88);
  local_88._8_8_ = &PTR__SmallVector_003d7c78;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_60._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_60,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_60._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  local_60._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_58._0_8_ = &PTR__SmallVector_003d7c78;
  if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_38,local_38._M_head_impl);
  }
  uVar4 = 1;
LAB_001d176a:
  return SUB41(uVar4,0);
}

Assistant:

bool CombineAccessChains::CombineIndices(Instruction* ptr_input,
                                         Instruction* inst,
                                         std::vector<Operand>* new_operands) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::ConstantManager* constant_mgr = context()->get_constant_mgr();

  Instruction* last_index_inst = def_use_mgr->GetDef(
      ptr_input->GetSingleWordInOperand(ptr_input->NumInOperands() - 1));
  const analysis::Constant* last_index_constant =
      constant_mgr->GetConstantFromInst(last_index_inst);

  Instruction* element_inst =
      def_use_mgr->GetDef(inst->GetSingleWordInOperand(1));
  const analysis::Constant* element_constant =
      constant_mgr->GetConstantFromInst(element_inst);

  // Combine the last index of the AccessChain (|ptr_inst|) with the element
  // operand of the PtrAccessChain (|inst|).
  const bool combining_element_operands =
      IsPtrAccessChain(inst->opcode()) &&
      IsPtrAccessChain(ptr_input->opcode()) && ptr_input->NumInOperands() == 2;
  uint32_t new_value_id = 0;
  const analysis::Type* type = GetIndexedType(ptr_input);
  if (last_index_constant && element_constant) {
    // Combine the constants.
    uint32_t new_value = GetConstantValue(last_index_constant) +
                         GetConstantValue(element_constant);
    const analysis::Constant* new_value_constant =
        constant_mgr->GetConstant(last_index_constant->type(), {new_value});
    Instruction* new_value_inst =
        constant_mgr->GetDefiningInstruction(new_value_constant);
    new_value_id = new_value_inst->result_id();
  } else if (!type->AsStruct() || combining_element_operands) {
    // Generate an addition of the two indices.
    InstructionBuilder builder(
        context(), inst,
        IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
    Instruction* addition = builder.AddIAdd(last_index_inst->type_id(),
                                            last_index_inst->result_id(),
                                            element_inst->result_id());
    new_value_id = addition->result_id();
  } else {
    // Indexing into structs must be constant, so bail out here.
    return false;
  }
  new_operands->push_back({SPV_OPERAND_TYPE_ID, {new_value_id}});
  return true;
}